

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entdec.c
# Opt level: O0

int od_ec_decode_bool_q15(od_ec_dec *dec,uint f)

{
  int iVar1;
  int iVar2;
  uint in_ESI;
  long in_RDI;
  bool bVar3;
  int ret;
  uint v;
  uint r_new;
  uint r;
  od_ec_window vw;
  od_ec_window dif;
  uint in_stack_ffffffffffffffd8;
  
  iVar1 = ((uint)(*(ushort *)(in_RDI + 0x24) >> 8) * (in_ESI >> 6) >> 1) + 4;
  bVar3 = (uint)(iVar1 * 0x10000) <= *(uint *)(in_RDI + 0x20);
  iVar2 = iVar1;
  if (bVar3) {
    iVar2 = (uint)*(ushort *)(in_RDI + 0x24) - iVar1;
  }
  iVar2 = od_ec_dec_normalize((od_ec_dec *)CONCAT44(iVar2,iVar1),(uint)!bVar3,
                              in_stack_ffffffffffffffd8,0);
  return iVar2;
}

Assistant:

int od_ec_decode_bool_q15(od_ec_dec *dec, unsigned f) {
  od_ec_window dif;
  od_ec_window vw;
  unsigned r;
  unsigned r_new;
  unsigned v;
  int ret;
  assert(0 < f);
  assert(f < 32768U);
  dif = dec->dif;
  r = dec->rng;
  assert(dif >> (OD_EC_WINDOW_SIZE - 16) < r);
  assert(32768U <= r);
  v = ((r >> 8) * (uint32_t)(f >> EC_PROB_SHIFT) >> (7 - EC_PROB_SHIFT));
  v += EC_MIN_PROB;
  vw = (od_ec_window)v << (OD_EC_WINDOW_SIZE - 16);
  ret = 1;
  r_new = v;
  if (dif >= vw) {
    r_new = r - v;
    dif -= vw;
    ret = 0;
  }
  return od_ec_dec_normalize(dec, dif, r_new, ret);
}